

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::IntField::IntField(IntField *this,int field)

{
  allocator<char> local_39;
  string local_38;
  int local_14;
  IntField *pIStack_10;
  int field_local;
  IntField *this_local;
  
  local_14 = field;
  pIStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__IntField_0032f998;
  return;
}

Assistant:

IntField(int field)
      : FieldBase(field, "") {}